

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

void CoreML::downgradeSpecificationVersion(Model *pModel)

{
  uint32 uVar1;
  bool bVar2;
  Pipeline *pPVar3;
  PipelineRegressor *this;
  PipelineClassifier *this_00;
  Type *pModel_00;
  int i;
  int iVar4;
  
  if (pModel == (Model *)0x0) {
    return;
  }
  iVar4 = pModel->specificationversion_;
  if (iVar4 == 0 || 5 < iVar4) {
    pModel->specificationversion_ = 5;
LAB_002070a9:
    bVar2 = hasIOS14Features(pModel);
    if (bVar2) {
      iVar4 = pModel->specificationversion_;
      goto LAB_002070b8;
    }
    pModel->specificationversion_ = 4;
LAB_002070c6:
    bVar2 = hasIOS13Features(pModel);
    if (bVar2) {
      iVar4 = pModel->specificationversion_;
      goto LAB_002070d5;
    }
    pModel->specificationversion_ = 3;
LAB_002070e3:
    bVar2 = hasIOS12Features(pModel);
    if (bVar2) {
      iVar4 = pModel->specificationversion_;
      goto LAB_002070f2;
    }
    pModel->specificationversion_ = 2;
  }
  else {
    if (iVar4 == 5) goto LAB_002070a9;
LAB_002070b8:
    if (iVar4 == 4) goto LAB_002070c6;
LAB_002070d5:
    if (iVar4 == 3) goto LAB_002070e3;
LAB_002070f2:
    if (iVar4 != 2) goto LAB_00207113;
  }
  bVar2 = hasIOS11_2Features(pModel);
  if (!bVar2) {
    pModel->specificationversion_ = 1;
  }
LAB_00207113:
  uVar1 = pModel->_oneof_case_[0];
  if (uVar1 == 200) {
    this_00 = Specification::Model::mutable_pipelineclassifier(pModel);
    pPVar3 = Specification::PipelineClassifier::mutable_pipeline(this_00);
  }
  else if (uVar1 == 0xc9) {
    this = Specification::Model::mutable_pipelineregressor(pModel);
    pPVar3 = Specification::PipelineRegressor::mutable_pipeline(this);
  }
  else {
    if (uVar1 != 0xca) {
      return;
    }
    pPVar3 = Specification::Model::mutable_pipeline(pModel);
  }
  if (pPVar3 != (Pipeline *)0x0) {
    for (iVar4 = 0; iVar4 < (pPVar3->models_).super_RepeatedPtrFieldBase.current_size_;
        iVar4 = iVar4 + 1) {
      pModel_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Mutable<google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::TypeHandler>
                            (&(pPVar3->models_).super_RepeatedPtrFieldBase,iVar4);
      downgradeSpecificationVersion(pModel_00);
    }
  }
  return;
}

Assistant:

void CoreML::downgradeSpecificationVersion(Specification::Model *pModel) {

    if (!pModel) { return; }


    if (pModel->specificationversion() == 0 || pModel->specificationversion() > MLMODEL_SPECIFICATION_VERSION_NEWEST) {
        // If mistakenly set specification verion or never set and left as default
        // lets start at the newest specification version and downgrade from there
        pModel->set_specificationversion(MLMODEL_SPECIFICATION_VERSION_NEWEST);
    }


    if (pModel->specificationversion() == MLMODEL_SPECIFICATION_VERSION_IOS14 && !hasIOS14Features(*pModel)) {
        pModel->set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);
    }

    if (pModel->specificationversion() == MLMODEL_SPECIFICATION_VERSION_IOS13 && !hasIOS13Features(*pModel)) {
        pModel->set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS12);
    }

    if (pModel->specificationversion() == MLMODEL_SPECIFICATION_VERSION_IOS12 && !hasIOS12Features(*pModel)) {
        pModel->set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS11_2);
    }

    if (pModel->specificationversion() == MLMODEL_SPECIFICATION_VERSION_IOS11_2 && !hasIOS11_2Features(*pModel)) {
        pModel->set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS11);
    }

    ::CoreML::Specification::Pipeline *pipeline = NULL;
    auto modelType = pModel->Type_case();
    if (modelType == Specification::Model::kPipeline) {
        pipeline = pModel->mutable_pipeline();
    } else if (modelType == Specification::Model::kPipelineRegressor) {
        pipeline = pModel->mutable_pipelineregressor()->mutable_pipeline();
    } else if (modelType == Specification::Model::kPipelineClassifier) {
        pipeline = pModel->mutable_pipelineclassifier()->mutable_pipeline();
    }

    if (pipeline) {
        for (int i=0; i< pipeline->models_size(); i++) {
            downgradeSpecificationVersion(pipeline->mutable_models(i));
        }
    }

}